

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O2

void highbd_obmc_variance64
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint64_t *sse,
               int64_t *sum)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  long lVar8;
  
  lVar4 = (long)pre8 * 2;
  iVar1 = 0;
  uVar5 = (ulong)(uint)w;
  if (w < 1) {
    uVar5 = 0;
  }
  if (h < 1) {
    h = 0;
  }
  uVar7 = 0;
  lVar8 = 0;
  for (; iVar1 != h; iVar1 = iVar1 + 1) {
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = wsrc[uVar6] - (uint)*(ushort *)(lVar4 + uVar6 * 2) * mask[uVar6];
      if (iVar2 < 0) {
        uVar3 = -(0x800U - iVar2 >> 0xc);
      }
      else {
        uVar3 = iVar2 + 0x800U >> 0xc;
      }
      lVar8 = lVar8 + (int)uVar3;
      uVar7 = uVar7 + uVar3 * uVar3;
    }
    mask = mask + (uint)w;
    lVar4 = lVar4 + (long)pre_stride * 2;
    wsrc = wsrc + (uint)w;
  }
  *sse = uVar7;
  *sum = lVar8;
  return;
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}